

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O0

ACT_TYPE __thiscall
despot::AdventurerSmartPolicy::Action
          (AdventurerSmartPolicy *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  bool bVar1;
  size_type sVar2;
  const_reference ppSVar3;
  State *particle;
  int i;
  bool at_goal;
  History *history_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  AdventurerSmartPolicy *this_local;
  
  bVar1 = true;
  particle._0_4_ = 0;
  while( true ) {
    sVar2 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(particles);
    if (sVar2 <= (ulong)(long)(int)particle) break;
    ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (particles,(long)(int)particle);
    if (*(int *)(*ppSVar3 + 0xc) % this->regdemo_model_->size_ != this->regdemo_model_->size_ + -1)
    {
      bVar1 = false;
    }
    particle._0_4_ = (int)particle + 1;
  }
  if (bVar1) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = 2;
  }
  return this_local._4_4_;
}

Assistant:

ACT_TYPE Action(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		bool at_goal = true;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			if (static_cast<AdventurerState*>(particle)->state_id
				% regdemo_model_->size_ != regdemo_model_->size_ - 1) {
				at_goal = false;
			}
		}

		if (at_goal) {
			return regdemo_model_->A_STAY;
		}
		return regdemo_model_->A_RIGHT;
	}